

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::format<unsigned_long,unsigned_int>(bilingual_str *fmt,unsigned_long *args,uint *args_1)

{
  long lVar1;
  unsigned_long *args_00;
  uint *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined1 in_stack_ffffffffffffff5f;
  unsigned_long *in_stack_ffffffffffffff60;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff68;
  bilingual_str *fmt_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fmt_00 = in_RDI;
  args_00 = format<unsigned_long,unsigned_int>(bilingual_str_const&,unsigned_long_const&,unsigned_int_const&)
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                       (bool)in_stack_ffffffffffffff5f);
  format<unsigned_long,unsigned_int>(bilingual_str_const&,unsigned_long_const&,unsigned_int_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
             (bool)in_stack_ffffffffffffff5f);
  format<unsigned_long,unsigned_int>(&fmt_00->original,args_00,in_RSI);
  format<unsigned_long,unsigned_int>(bilingual_str_const&,unsigned_long_const&,unsigned_int_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  format<unsigned_long,unsigned_int>(bilingual_str_const&,unsigned_long_const&,unsigned_int_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff68,(uint *)in_stack_ffffffffffffff60,
             (bool)in_stack_ffffffffffffff5f);
  format<unsigned_long,unsigned_int>(&fmt_00->original,args_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}